

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.hpp
# Opt level: O0

int __thiscall xercesc_4_0::XMLDateTime::copy(XMLDateTime *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  undefined4 extraout_var;
  int local_1c;
  int i;
  XMLDateTime *rhs_local;
  XMLDateTime *this_local;
  
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    src = (EVP_PKEY_CTX *)(ulong)*(uint *)(dst + (long)local_1c * 4 + 8);
    this->fValue[local_1c] = *(uint *)(dst + (long)local_1c * 4 + 8);
  }
  this->fMilliSecond = *(double *)(dst + 0x48);
  this->fHasTime = (bool)((byte)dst[0x50] & 1);
  this->fTimeZone[0] = *(int *)(dst + 0x28);
  this->fTimeZone[1] = *(int *)(dst + 0x2c);
  this->fStart = *(XMLSize_t *)(dst + 0x30);
  this->fEnd = *(XMLSize_t *)(dst + 0x38);
  if (this->fEnd != 0) {
    if (this->fBufferMaxLen < this->fEnd) {
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fBuffer,src);
      this->fBufferMaxLen = *(XMLSize_t *)(dst + 0x40);
      iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,(this->fBufferMaxLen + 1) * 2);
      this->fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar1);
    }
    this = (XMLDateTime *)memcpy(this->fBuffer,*(void **)(dst + 0x58),(this->fEnd + 1) * 2);
  }
  return (int)this;
}

Assistant:

inline void XMLDateTime::copy(const XMLDateTime& rhs)
{
    for ( int i = 0; i < TOTAL_SIZE; i++ )
        fValue[i] = rhs.fValue[i];

    fMilliSecond   = rhs.fMilliSecond;
    fHasTime      = rhs.fHasTime;
    fTimeZone[hh] = rhs.fTimeZone[hh];
    fTimeZone[mm] = rhs.fTimeZone[mm];
    fStart = rhs.fStart;
    fEnd   = rhs.fEnd;

    if (fEnd > 0)
    {
        if (fEnd > fBufferMaxLen)
        {
            fMemoryManager->deallocate(fBuffer);//delete[] fBuffer;
            fBufferMaxLen = rhs.fBufferMaxLen;
            fBuffer = (XMLCh*) fMemoryManager->allocate((fBufferMaxLen+1) * sizeof(XMLCh));
        }

        memcpy(fBuffer, rhs.fBuffer, (fEnd+1) * sizeof(XMLCh));
    }
}